

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_img_fmt_t get_img_format(int subsampling_x,int subsampling_y,int use_highbitdepth)

{
  aom_img_fmt_t fmt;
  int use_highbitdepth_local;
  int subsampling_y_local;
  int subsampling_x_local;
  
  fmt = AOM_IMG_FMT_NONE;
  if ((subsampling_x == 0) && (subsampling_y == 0)) {
    fmt = AOM_IMG_FMT_I444;
  }
  else if ((subsampling_x == 1) && (subsampling_y == 0)) {
    fmt = AOM_IMG_FMT_I422;
  }
  else if ((subsampling_x == 1) && (subsampling_y == 1)) {
    fmt = AOM_IMG_FMT_I420;
  }
  if (use_highbitdepth != 0) {
    fmt = fmt | 0x800;
  }
  return fmt;
}

Assistant:

static aom_img_fmt_t get_img_format(int subsampling_x, int subsampling_y,
                                    int use_highbitdepth) {
  aom_img_fmt_t fmt = 0;

  if (subsampling_x == 0 && subsampling_y == 0)
    fmt = AOM_IMG_FMT_I444;
  else if (subsampling_x == 1 && subsampling_y == 0)
    fmt = AOM_IMG_FMT_I422;
  else if (subsampling_x == 1 && subsampling_y == 1)
    fmt = AOM_IMG_FMT_I420;

  if (use_highbitdepth) fmt |= AOM_IMG_FMT_HIGHBITDEPTH;
  return fmt;
}